

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

token * parse_enum_declaration(dmr_C *C,token *token,symbol *parent)

{
  byte *pbVar1;
  symbol *psVar2;
  position pVar3;
  global_symbols_t *pgVar4;
  expression *expr_00;
  dmr_C *pdVar5;
  int iVar6;
  position pVar7;
  unsigned_long_long uVar8;
  symbol *sym;
  void *pvVar9;
  byte bVar10;
  ptr_list *ppVar11;
  ptr_list *ppVar12;
  ulong uVar13;
  char cVar14;
  ptr_list *ppVar15;
  long lVar16;
  int iVar17;
  bool bVar18;
  ptr_list *local_88;
  expression *expr;
  unsigned_long_long local_70;
  ptr_list *local_68;
  ptr_list *local_60;
  int local_54;
  ulong local_50;
  dmr_C *local_48;
  ulong local_40;
  int local_34;
  
  pbVar1 = (byte *)((long)&parent->field_14 + 0xe);
  *pbVar1 = *pbVar1 | 0x10;
  (parent->field_14).field_2.ctype.base_type = &C->S->int_ctype;
  local_34 = 1;
  iVar17 = -1;
  local_40 = 0;
  local_50 = 0;
  ppVar15 = (ptr_list *)0x0;
  local_68 = (ptr_list *)0x0;
  uVar8 = 0;
  local_60 = (ptr_list *)parent;
  local_48 = C;
  while (pdVar5 = local_48, pVar7 = (position)token, (*(uint *)token & 0x3f) == 2) {
    local_88 = (ptr_list *)0x0;
    pVar7 = *(position *)((long)token + 8);
    local_54 = iVar17;
    if (((*(uint *)pVar7 & 0x3f) == 0x11) && (*(uint *)((long)pVar7 + 0x10) == 0x3d)) {
      pVar7 = (position)
              dmrC_conditional_expression
                        (local_48,*(token **)((long)pVar7 + 8),
                         (expression **)&stack0xffffffffffffff78);
      uVar8 = dmrC_get_expression_value(pdVar5,(expression *)local_88);
      ppVar15 = (ptr_list *)&pdVar5->S->void_ctype;
      if ((local_88 != (ptr_list *)0x0) && (local_88->next_ != (ptr_list *)0x0)) {
        ppVar15 = local_88->next_;
      }
    }
    else if (ppVar15 == (ptr_list *)0x0) {
      ppVar15 = (ptr_list *)&local_48->S->int_ctype;
    }
    else {
      ppVar12 = ppVar15;
      if (*(char *)ppVar15 == '\x03') {
        ppVar12 = (ptr_list *)ppVar15->list_[0xc];
      }
      if (*(char *)ppVar12 == '\t') {
        ppVar12 = (ptr_list *)ppVar12->list_[0xc];
      }
      if ((*(char *)ppVar12 != '\r') && ((symbol *)ppVar12->list_[0xc] != &local_48->S->int_type)) {
        dmrC_error_die(local_48,token->pos,"can\'t increment the last enum member");
      }
      uVar8 = uVar8 + 1;
    }
    local_70 = uVar8;
    if (local_88 == (ptr_list *)0x0) {
      pVar3 = token->pos;
      local_88 = (ptr_list *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)local_88 = 1;
      *(position *)&local_88->prev_ = pVar3;
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)local_88->list_)->field_0).value = local_70;
      local_88->next_ = ppVar15;
    }
    pdVar5 = local_48;
    sym = dmrC_alloc_symbol(local_48->S,token->pos,3);
    dmrC_bind_symbol(pdVar5->S,sym,*(ident **)((long)token + 0x10),NS_SYMBOL);
    pbVar1 = (byte *)((long)&sym->field_14 + 0x1a);
    *pbVar1 = *pbVar1 & 0xf7;
    (sym->field_14).field_2.initializer = (expression *)local_88;
    sym->field_0x2 = sym->field_0x2 | 0x10;
    (sym->field_14).field_2.ctype.base_type = (symbol *)local_60;
    ptrlist_add((ptr_list **)&(parent->field_14).field_2.symbol_list,sym,&C->ptrlist_allocator);
    pgVar4 = pdVar5->S;
    psVar2 = &pgVar4->bad_ctype;
    if (local_68 != (ptr_list *)psVar2) {
      if (*(char *)ppVar15 == '\x03') {
        ppVar15 = (ptr_list *)ppVar15->list_[0xc];
      }
      ppVar12 = ppVar15;
      if ((*(char *)ppVar15 == '\t') && (ppVar12 = local_68, ppVar15 != local_60)) {
        ppVar12 = (ptr_list *)ppVar15->list_[0xc];
      }
      ppVar15 = ppVar12;
      if ((local_68 != (ptr_list *)0x0) && (ppVar15 = local_68, ppVar12 != local_68)) {
        ppVar11 = local_68;
        if (*(char *)local_68 == '\x03') {
          ppVar11 = (ptr_list *)local_68->list_[0xc];
        }
        if (*(char *)ppVar11 == '\t') {
          ppVar11 = (ptr_list *)ppVar11->list_[0xc];
        }
        ppVar15 = (ptr_list *)psVar2;
        if ((*(char *)ppVar11 == '\r') || ((symbol *)ppVar11->list_[0xc] == &pgVar4->int_type)) {
          ppVar11 = ppVar12;
          if (*(char *)ppVar12 == '\x03') {
            ppVar11 = (ptr_list *)ppVar12->list_[0xc];
          }
          if (*(char *)ppVar11 == '\t') {
            ppVar11 = (ptr_list *)ppVar11->list_[0xc];
          }
          if ((*(char *)ppVar11 == '\r') || ((symbol *)ppVar11->list_[0xc] == &pgVar4->int_type)) {
            ppVar11 = ppVar12;
            if ((*(int *)(ppVar12->list_ + 6) <= *(int *)(local_68->list_ + 6)) &&
               ((ppVar11 = local_68, *(int *)(local_68->list_ + 6) == *(int *)(ppVar12->list_ + 6)
                && ((*(byte *)(ppVar12->list_ + 8) & 0x80) != 0)))) {
              ppVar11 = ppVar12;
            }
            ppVar15 = (ptr_list *)&pgVar4->int_ctype;
            if (local_48->target->bits_in_int <= *(int *)(ppVar11->list_ + 6)) {
              ppVar15 = ppVar11;
            }
          }
        }
      }
      local_60->list_[0xc] = ppVar15;
      local_68 = ppVar15;
      ppVar15 = ppVar12;
    }
    ppVar12 = local_68;
    if (*(char *)local_68 == '\x03') {
      ppVar12 = (ptr_list *)local_68->list_[0xc];
    }
    if (*(char *)ppVar12 == '\t') {
      ppVar12 = (ptr_list *)ppVar12->list_[0xc];
    }
    iVar17 = local_54;
    if ((*(char *)ppVar12 == '\r') || ((symbol *)ppVar12->list_[0xc] == &local_48->S->int_type)) {
      iVar6 = (int)((long)local_70 >> 0x3f);
      if ((*(byte *)(ppVar15->list_ + 8) & 0x80) != 0) {
        iVar6 = 0;
      }
      uVar13 = local_50;
      if (((local_54 <= iVar6) && (uVar13 = local_70, iVar17 = iVar6, iVar6 <= local_54)) &&
         (uVar13 = local_50, iVar17 = local_54, local_50 <= local_70)) {
        uVar13 = local_70;
      }
      local_50 = uVar13;
      if (iVar6 <= local_34) {
        if (iVar6 < local_34) {
          local_40 = local_70;
          local_34 = iVar6;
        }
        else if (local_70 <= local_40) {
          local_40 = local_70;
        }
      }
    }
    sym->endpos = *(position *)pVar7;
    bVar18 = true;
    if ((*(uint *)pVar7 & 0x3f) == 0x11) {
      bVar18 = *(uint *)((long)pVar7 + 0x10) != 0x2c;
    }
    if (bVar18) break;
    uVar8 = local_70;
    token = *(token **)((long)pVar7 + 8);
  }
  pdVar5 = local_48;
  if (local_68 == (ptr_list *)0x0) {
    dmrC_sparse_error(local_48,*(position *)pVar7,"bad enum definition");
    ppVar15 = (ptr_list *)&pdVar5->S->bad_ctype;
  }
  else {
    ppVar12 = local_68;
    if (*(char *)local_68 == '\x03') {
      ppVar12 = (ptr_list *)local_68->list_[0xc];
    }
    if (*(char *)ppVar12 == '\t') {
      ppVar12 = (ptr_list *)ppVar12->list_[0xc];
    }
    pgVar4 = local_48->S;
    ppVar15 = local_68;
    if ((*(char *)ppVar12 == '\r') || ((symbol *)ppVar12->list_[0xc] == &pgVar4->int_type)) {
      cVar14 = (char)local_68->list_[8];
      bVar10 = (char)*(undefined4 *)(local_68->list_ + 6) - (-1 < cVar14);
      if (((iVar17 == 0) && (local_50 >> (bVar10 & 0x3f) != 0)) ||
         ((local_34 != 0 && ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))))) {
        cVar14 = (char)(pgVar4->int_ctype).field_14.field_2.ctype.modifiers;
        bVar10 = (char)(pgVar4->int_ctype).field_14.field_1.normal - (-1 < cVar14);
        if (((iVar17 == 0) && (local_50 >> (bVar10 & 0x3f) != 0)) ||
           ((ppVar15 = (ptr_list *)&pgVar4->int_ctype, local_34 != 0 &&
            ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))))) {
          cVar14 = (char)(pgVar4->uint_ctype).field_14.field_2.ctype.modifiers;
          bVar10 = (char)(pgVar4->uint_ctype).field_14.field_1.normal - (-1 < cVar14);
          if (((iVar17 == 0) && (local_50 >> (bVar10 & 0x3f) != 0)) ||
             ((ppVar15 = (ptr_list *)&pgVar4->uint_ctype, local_34 != 0 &&
              ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))))) {
            cVar14 = (char)(pgVar4->long_ctype).field_14.field_2.ctype.modifiers;
            bVar10 = (char)(pgVar4->long_ctype).field_14.field_1.normal - (-1 < cVar14);
            if (((iVar17 == 0) && (local_50 >> (bVar10 & 0x3f) != 0)) ||
               ((ppVar15 = (ptr_list *)&pgVar4->long_ctype, local_34 != 0 &&
                ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))))) {
              cVar14 = (char)(pgVar4->ulong_ctype).field_14.field_2.ctype.modifiers;
              bVar10 = (char)(pgVar4->ulong_ctype).field_14.field_1.normal - (-1 < cVar14);
              if (((iVar17 == 0) && (local_50 >> (bVar10 & 0x3f) != 0)) ||
                 ((ppVar15 = (ptr_list *)&pgVar4->ulong_ctype, local_34 != 0 &&
                  ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))))) {
                cVar14 = (char)(pgVar4->llong_ctype).field_14.field_2.ctype.modifiers;
                bVar10 = (char)(pgVar4->llong_ctype).field_14.field_1.normal - (-1 < cVar14);
                if (((iVar17 == 0) && (local_50 >> (bVar10 & 0x3f) != 0)) ||
                   ((ppVar15 = (ptr_list *)&pgVar4->llong_ctype, local_34 != 0 &&
                    ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))))) {
                  cVar14 = (char)(pgVar4->ullong_ctype).field_14.field_2.ctype.modifiers;
                  bVar10 = (char)(pgVar4->ullong_ctype).field_14.field_1.normal - (-1 < cVar14);
                  lVar16 = 0x1c20;
                  if ((((iVar17 != 0) || (local_50 >> (bVar10 & 0x3f) == 0)) &&
                      (lVar16 = 0x1140, local_34 != 0)) &&
                     ((cVar14 < '\0' || (~local_40 >> (bVar10 & 0x3f) != 0)))) {
                    lVar16 = 0x1c20;
                  }
                  ppVar15 = (ptr_list *)((long)&pgVar4->C + lVar16);
                }
              }
            }
          }
        }
      }
    }
  }
  local_60->list_[0xc] = ppVar15;
  local_60->list_[8] = (void *)((ulong)local_60->list_[8] | (ulong)ppVar15->list_[8] & 0x80);
  pbVar1 = (byte *)((long)local_60->list_ + 0x36);
  *pbVar1 = *pbVar1 & 0xef;
  ptrlist_forward_iterator
            ((ptr_list_iter *)&stack0xffffffffffffff78,(ptr_list *)local_60->list_[0xf]);
  while (pvVar9 = ptrlist_iter_next((ptr_list_iter *)&stack0xffffffffffffff78),
        pvVar9 != (void *)0x0) {
    expr_00 = *(expression **)((long)pvVar9 + 0xb0);
    if ((*(char *)expr_00 == '\x01') &&
       ((expr_00->ctype->field_14).field_1.normal != *(int *)(ppVar15->list_ + 6))) {
      dmrC_cast_value(local_48,expr_00,(symbol *)ppVar15,expr_00,expr_00->ctype);
    }
  }
  return (token *)pVar7;
}

Assistant:

static struct token *parse_enum_declaration(struct dmr_C *C, struct token *token, struct symbol *parent)
{
	unsigned long long lastval = 0;
	struct symbol *ctype = NULL, *base_type = NULL;
	Num upper = {-1, 0}, lower = {1, 0};

	parent->examined = 1;
	parent->ctype.base_type = &C->S->int_ctype;
	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct expression *expr = NULL;
		struct token *next = token->next;
		struct symbol *sym;

		if (dmrC_match_op(next, '=')) {
			next = dmrC_constant_expression(C, next->next, &expr);
			lastval = dmrC_get_expression_value(C, expr);
			ctype = &C->S->void_ctype;
			if (expr && expr->ctype)
				ctype = expr->ctype;
		} else if (!ctype) {
			ctype = &C->S->int_ctype;
		} else if (dmrC_is_int_type(C->S, ctype)) {
			lastval++;
		} else {
			dmrC_error_die(C, token->pos, "can't increment the last enum member");
		}

		if (!expr) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			expr->value = lastval;
			expr->ctype = ctype;
		}

		sym = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, token->ident, NS_SYMBOL);
		sym->ctype.modifiers &= ~MOD_ADDRESSABLE;
		sym->initializer = expr;
		sym->enum_member = 1;
		sym->ctype.base_type = parent;
		dmrC_add_symbol(C, &parent->symbol_list, sym);

		if (base_type != &C->S->bad_ctype) {
			if (ctype->type == SYM_NODE)
				ctype = ctype->ctype.base_type;
			if (ctype->type == SYM_ENUM) {
				if (ctype == parent)
					ctype = base_type;
				else 
					ctype = ctype->ctype.base_type;
			}
			/*
			 * base_type rules:
			 *  - if all enums are of the same type, then
			 *    the base_type is that type (two first
			 *    cases)
			 *  - if enums are of different types, they
			 *    all have to be integer types, and the
			 *    base type is at least "int_ctype".
			 *  - otherwise the base_type is "bad_ctype".
			 */
			if (!base_type) {
				base_type = ctype;
			} else if (ctype == base_type) {
				/* nothing */
			} else if (dmrC_is_int_type(C->S, base_type) && dmrC_is_int_type(C->S, ctype)) {
				base_type = bigger_enum_type(C, base_type, ctype);
			} else
				base_type = &C->S->bad_ctype;
			parent->ctype.base_type = base_type;
		}
		if (dmrC_is_int_type(C->S, base_type)) {
			Num v = {.y = lastval};
			if (ctype->ctype.modifiers & MOD_UNSIGNED)
				v.x = 0;
			else if ((long long)lastval >= 0)
				v.x = 0;
			else
				v.x = -1;
			upper_boundary(&upper, &v);
			lower_boundary(&lower, &v);
		}
		token = next;

		sym->endpos = token->pos;

		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}
	if (!base_type) {
		dmrC_sparse_error(C, token->pos, "bad enum definition");
		base_type = &C->S->bad_ctype;
	}
	else if (!dmrC_is_int_type(C->S, base_type))
                ; //base_type = base_type;
	else if (type_is_ok(C, base_type, &upper, &lower))
                ; //base_type = base_type;
	else if (type_is_ok(C, &C->S->int_ctype, &upper, &lower))
		base_type = &C->S->int_ctype;
	else if (type_is_ok(C, &C->S->uint_ctype, &upper, &lower))
		base_type = &C->S->uint_ctype;
	else if (type_is_ok(C, &C->S->long_ctype, &upper, &lower))
		base_type = &C->S->long_ctype;
	else if (type_is_ok(C, &C->S->ulong_ctype, &upper, &lower))
		base_type = &C->S->ulong_ctype;
	else if (type_is_ok(C, &C->S->llong_ctype, &upper, &lower))
		base_type = &C->S->llong_ctype;
	else if (type_is_ok(C, &C->S->ullong_ctype, &upper, &lower))
		base_type = &C->S->ullong_ctype;
	else
		base_type = &C->S->bad_ctype;
	parent->ctype.base_type = base_type;
	parent->ctype.modifiers |= (base_type->ctype.modifiers & MOD_UNSIGNED);
	parent->examined = 0;

	cast_enum_list(C, parent->symbol_list, base_type);

	return token;
}